

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

Matrix3d * __thiscall
ear::QuadRegion::_calcPolyBasis
          (Matrix3d *__return_storage_ptr__,QuadRegion *this,MatrixXd *positions)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_00;
  DstEvaluatorType dstEvaluator;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Matrix3d polyBasis;
  Matrix3d *local_138;
  long local_130;
  long local_128;
  long local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  Matrix3d local_f0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double *local_28;
  double *local_20;
  
  pdVar2 = (positions->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar3 = (positions->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols;
  if (lVar3 < 0 && pdVar2 != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                 );
  }
  lVar4 = (positions->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  if (0 < lVar4) {
    if (lVar3 != 3) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
                   );
    }
    if (((lVar4 != 1) && (2 < lVar4)) && (lVar4 != 3)) {
      local_a8 = *pdVar2;
      local_98 = pdVar2[lVar4];
      local_88 = pdVar2[lVar4 * 2];
      local_118 = pdVar2[3];
      local_110 = pdVar2[lVar4 + 3];
      dVar1 = pdVar2[lVar4 * 2 + 3];
      dVar6 = pdVar2[lVar4 + 1] - local_98;
      dVar9 = pdVar2[lVar4 * 2 + 2] - dVar1;
      dVar7 = pdVar2[lVar4 * 2 + 1] - local_88;
      dVar10 = pdVar2[lVar4 + 2] - local_110;
      local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = dVar6 * dVar9 - dVar10 * dVar7;
      dVar8 = pdVar2[2] - local_118;
      uStack_a0 = 0;
      dVar5 = pdVar2[1] - local_a8;
      local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = dVar7 * dVar8 - dVar9 * dVar5;
      local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = dVar5 * dVar10 - dVar8 * dVar6;
      local_108 = local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0];
      local_100 = local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1];
      local_f8 = local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2];
      local_130 = 0;
      local_128 = 1;
      local_120 = 3;
      uStack_a0 = 0;
      local_40 = local_98 * dVar9 - dVar10 * local_88;
      local_38 = local_88 * dVar8 - dVar9 * local_a8;
      local_30 = local_a8 * dVar10 - dVar8 * local_98;
      local_28 = &local_40;
      local_58 = dVar6 * dVar1 + -dVar7 * local_110;
      local_50 = dVar7 * local_118 + -dVar5 * dVar1;
      local_48 = dVar5 * local_110 + -dVar6 * local_118;
      local_20 = &local_58;
      uStack_90 = 0;
      uStack_80 = 0;
      local_138 = &local_f0;
      this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *)&local_138,
                           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)&local_28);
      local_70 = local_98 * dVar1 + -local_88 * local_110;
      local_68 = local_88 * local_118 + -local_a8 * dVar1;
      local_60 = local_a8 * local_110 + -local_98 * local_118;
      Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *)this_00,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_70);
      if ((local_120 + local_130 == 3) && (local_128 == 3)) {
        if (&local_f0 == __return_storage_ptr__) {
          __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Transpose.h"
                        ,0x1b6,
                        "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Matrix<double, 3, 3>, Eigen::Transpose<Eigen::Matrix<double, 3, 3>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Matrix<double, 3, 3>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 3>>, MightHaveTransposeAliasing = true]"
                       );
        }
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[0] =
             local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[0];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[1] =
             local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[3];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[2] =
             local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[6];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[3] =
             local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[1];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[4] =
             local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[4];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[5] =
             local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[7];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[6] =
             local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[2];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[7] =
             local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[5];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[8] =
             local_f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[8];
        return __return_storage_ptr__;
      }
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x7c,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                   );
    }
  }
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                ,0x7a,
                "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

Eigen::Matrix3d QuadRegion::_calcPolyBasis(Eigen::MatrixXd positions) {
    Eigen::Vector3d a = positions.row(0);
    Eigen::Vector3d b = positions.row(1);
    Eigen::Vector3d c = positions.row(2);
    Eigen::Vector3d d = positions.row(3);

    Eigen::Matrix3d polyBasis;
    polyBasis <<  //
        (b - a).cross(c - d),  //
        a.cross(c - d) + (b - a).cross(d),  //
        a.cross(d);

    return polyBasis.transpose();
  }